

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleJitProfilingHelpers.cpp
# Opt level: O0

LoopEntryPointInfo * Js::SimpleJitHelpers::GetScheduledEntryPoint(void *framePtr,uint loopnum)

{
  bool bVar1;
  JavascriptCallStackLayout *pJVar2;
  FunctionBody *this;
  LoopHeader *this_00;
  LoopEntryPointInfo *entryPointInfo;
  LoopHeader *loopHeader;
  FunctionBody *functionBody;
  JavascriptCallStackLayout *layout;
  uint loopnum_local;
  void *framePtr_local;
  
  pJVar2 = JavascriptCallStackLayout::FromFramePointer(framePtr);
  this = JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)pJVar2);
  this_00 = FunctionBody::GetLoopHeader(this,loopnum);
  framePtr_local = LoopHeader::GetCurrentEntryPointInfo(this_00);
  bVar1 = EntryPointInfo::IsNotScheduled((EntryPointInfo *)framePtr_local);
  if (bVar1) {
    framePtr_local = (void *)0x0;
  }
  return (LoopEntryPointInfo *)framePtr_local;
}

Assistant:

LoopEntryPointInfo* SimpleJitHelpers::GetScheduledEntryPoint(void* framePtr, uint loopnum)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(SimpleGetScheduledEntryPoint);
        auto layout = JavascriptCallStackLayout::FromFramePointer(framePtr);
        FunctionBody* functionBody = layout->functionObject->GetFunctionBody();

        //REVIEW: Simplejit: Optimization: Don't emit this call if this is true during JIT time

        auto loopHeader = functionBody->GetLoopHeader(loopnum);
        LoopEntryPointInfo * entryPointInfo = loopHeader->GetCurrentEntryPointInfo();

        if (entryPointInfo->IsNotScheduled())
        {
            // Not scheduled yet! It will be impossible for this loop to be scheduled for a JIT unless we're the ones doing it,
            //   so there's no need to check whether the existing job is finished.
            return nullptr;
        }

        // The entry point has been scheduled, it is finished, or something else. Just return the entry point and the
        //   SimpleJitted function will check this on each iteration.
        return entryPointInfo;
        JIT_HELPER_END(SimpleGetScheduledEntryPoint);
    }